

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonConvert.h
# Opt level: O0

void __thiscall
Json::JsonConvert::JsonConvert
          (JsonConvert *this,JsonParser *jsonParser,bool format,int indent,bool escape)

{
  size_type sVar1;
  bool escape_local;
  int indent_local;
  bool format_local;
  JsonParser *jsonParser_local;
  JsonConvert *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->__lstJsonValue);
  std::shared_ptr<Json::JsonValue>::shared_ptr(&this->jsonValuePtr,(nullptr_t)0x0);
  this->__format = format;
  this->__ptr = 0;
  this->__indent = indent;
  jsonParser->__escape = escape;
  if ((jsonParser->__parser & 1U) == 0) {
    JsonParser::parseJsonDocument(jsonParser);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->__lstJsonValue,&jsonParser->jsonValue);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->__lstJsonValue);
  this->__len = (int)sVar1;
  return;
}

Assistant:

explicit JsonConvert(const JsonParser &jsonParser, bool format = false, int indent = 4, bool escape = false)
                : __format(format), __ptr(0), __indent(indent) {
            jsonParser.__escape = escape;
            if (!jsonParser.__parser) const_cast<JsonParser &>(jsonParser).parseJsonDocument();
            __lstJsonValue = jsonParser.jsonValue;
            __len = __lstJsonValue.size();
        }